

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O3

int Edg_ManAssignEdgeNew(Gia_Man_t *p,int nEdges,int fVerbose)

{
  void *__ptr;
  bool bVar1;
  uint DelayMax;
  int iVar2;
  int iVar3;
  Vec_Wec_t *vEdges;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int iVar6;
  size_t sVar7;
  size_t __nmemb;
  long lVar8;
  ulong local_68;
  uint local_60;
  Vec_Int_t *local_58;
  Vec_Int_t *local_50;
  ulong local_38;
  
  vEdges = (Vec_Wec_t *)calloc(1,0x10);
  if (fVerbose != 0) {
    printf("Running edge assignment with E = %d.\n");
  }
  Edg_ManToMapping(p);
  pVVar4 = p->vEdge1;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      p->vEdge1->pArray = (int *)0x0;
      pVVar4 = p->vEdge1;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_001fbdf0;
    }
    free(pVVar4);
    p->vEdge1 = (Vec_Int_t *)0x0;
  }
LAB_001fbdf0:
  pVVar4 = p->vEdge2;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      p->vEdge2->pArray = (int *)0x0;
      pVVar4 = p->vEdge2;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_001fbe38;
    }
    free(pVVar4);
    p->vEdge2 = (Vec_Int_t *)0x0;
  }
LAB_001fbe38:
  iVar2 = p->nObjs;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar6 = iVar2;
  }
  pVVar4->nCap = iVar6;
  if (iVar6 == 0) {
    pVVar4->pArray = (int *)0x0;
    pVVar4->nSize = iVar2;
    p->vEdge1 = pVVar4;
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 0;
    pVVar4->pArray = (int *)0x0;
    pVVar4->nSize = iVar2;
  }
  else {
    piVar5 = (int *)malloc((long)iVar6 << 2);
    pVVar4->pArray = piVar5;
    pVVar4->nSize = iVar2;
    if (piVar5 != (int *)0x0) {
      memset(piVar5,0,(long)iVar2 * 4);
    }
    p->vEdge1 = pVVar4;
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = iVar6;
    piVar5 = (int *)malloc((long)iVar6 << 2);
    pVVar4->pArray = piVar5;
    pVVar4->nSize = iVar2;
    if (piVar5 != (int *)0x0) {
      memset(piVar5,0,(long)iVar2 << 2);
    }
  }
  p->vEdge2 = pVVar4;
  local_60 = 1000000000;
  local_38 = 0xffffffff;
  local_68 = 0;
  local_58 = (Vec_Int_t *)0x0;
  local_50 = (Vec_Int_t *)0x0;
  do {
    DelayMax = Edg_ManEvalEdgeDelay(p);
    iVar2 = Edg_ManEvalEdgeDelayR(p);
    if (DelayMax != iVar2 + 1U) {
      __assert_fail("DelayD == DelayR + DelayNoEdge",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                    ,0x3b2,"int Edg_ManAssignEdgeNew(Gia_Man_t *, int, int)");
    }
    if ((int)DelayMax < (int)local_60) {
      if (local_50 != (Vec_Int_t *)0x0) {
        if (local_50->pArray != (int *)0x0) {
          free(local_50->pArray);
        }
        free(local_50);
      }
      pVVar4 = p->vEdge1;
      local_50 = (Vec_Int_t *)malloc(0x10);
      iVar2 = pVVar4->nSize;
      local_50->nSize = iVar2;
      local_50->nCap = iVar2;
      if ((long)iVar2 == 0) {
        sVar7 = 0;
        piVar5 = (int *)0x0;
      }
      else {
        sVar7 = (long)iVar2 << 2;
        piVar5 = (int *)malloc(sVar7);
      }
      local_50->pArray = piVar5;
      memcpy(piVar5,pVVar4->pArray,sVar7);
      if (local_58 != (Vec_Int_t *)0x0) {
        if (local_58->pArray != (int *)0x0) {
          free(local_58->pArray);
        }
        free(local_58);
      }
      pVVar4 = p->vEdge2;
      local_58 = (Vec_Int_t *)malloc(0x10);
      iVar2 = pVVar4->nSize;
      local_58->nSize = iVar2;
      local_58->nCap = iVar2;
      if ((long)iVar2 == 0) {
        sVar7 = 0;
        piVar5 = (int *)0x0;
      }
      else {
        sVar7 = (long)iVar2 << 2;
        piVar5 = (int *)malloc(sVar7);
      }
      local_58->pArray = piVar5;
      memcpy(piVar5,pVVar4->pArray,sVar7);
      local_38 = local_68;
      local_60 = DelayMax;
    }
    if (fVerbose != 0) {
      printf("\nIter %4d : Delay = %4d\n",local_68,(ulong)DelayMax);
    }
    Edg_ManCollectCritEdges(p,vEdges,DelayMax);
    iVar2 = vEdges->nSize;
    __nmemb = (size_t)iVar2;
    pVVar4 = vEdges->pArray;
    qsort(pVVar4,__nmemb,0x10,Vec_WecSortCompare1);
    sVar7 = 0;
    if (0 < (long)__nmemb) {
      do {
        iVar6 = pVVar4[sVar7].nSize;
        if (iVar6 < 1) {
          lVar8 = 0;
        }
        else {
          lVar8 = 0;
          do {
            iVar3 = Edg_ObjImprove(p,pVVar4[sVar7].pArray[lVar8],nEdges,DelayMax,fVerbose);
            iVar6 = pVVar4[sVar7].nSize;
            if (iVar3 != 0) break;
            lVar8 = lVar8 + 1;
          } while (lVar8 < iVar6);
        }
        if ((int)lVar8 < iVar6) break;
        sVar7 = sVar7 + 1;
        if (sVar7 == __nmemb) goto LAB_001fc17c;
      } while( true );
    }
  } while ((((int)sVar7 != iVar2) && ((uint)local_68 < 9999)) &&
          (bVar1 = (int)(uint)local_68 < (int)local_38 + 0x32,
          local_68 = (ulong)((uint)local_68 + 1), bVar1));
LAB_001fc17c:
  iVar2 = vEdges->nCap;
  if ((long)iVar2 < 1) {
    if (pVVar4 != (Vec_Int_t *)0x0) goto LAB_001fc1bd;
  }
  else {
    lVar8 = 0;
    do {
      __ptr = *(void **)((long)&pVVar4->pArray + lVar8);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pVVar4->pArray + lVar8) = 0;
      }
      lVar8 = lVar8 + 0x10;
    } while ((long)iVar2 * 0x10 != lVar8);
LAB_001fc1bd:
    free(pVVar4);
  }
  free(vEdges);
  pVVar4 = p->vEdge1;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      p->vEdge1->pArray = (int *)0x0;
      pVVar4 = p->vEdge1;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_001fc20c;
    }
    free(pVVar4);
  }
LAB_001fc20c:
  p->vEdge1 = local_50;
  pVVar4 = p->vEdge2;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      p->vEdge2->pArray = (int *)0x0;
      pVVar4 = p->vEdge2;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_001fc255;
    }
    free(pVVar4);
  }
LAB_001fc255:
  p->vEdge2 = local_58;
  return DelayMax;
}

Assistant:

int Edg_ManAssignEdgeNew( Gia_Man_t * p, int nEdges, int fVerbose )
{
    int DelayNoEdge = 1;
    int fLevelVerbose = 0;
    Vec_Int_t * vLevel;
    Vec_Wec_t * vEdges = Vec_WecStart(0);
    Vec_Int_t * vEdge1 = NULL, * vEdge2 = NULL;
    int DelayD = 0, DelayR = 0, DelayPrev = ABC_INFINITY;
    int k, j, i, iLast = -1, iObj;
    if ( fVerbose )
        printf( "Running edge assignment with E = %d.\n", nEdges );
    // create fanouts
    Edg_ManToMapping( p );
    // create empty assignment
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
    // perform optimization
    for ( i = 0; i < 10000; i++ )
    {
        // if there is no improvement after 10 iterations, quit
        if ( i > iLast + 50 )
            break;
        // create delay information
        DelayD = Edg_ManEvalEdgeDelay( p );
        DelayR = Edg_ManEvalEdgeDelayR( p );
        assert( DelayD == DelayR + DelayNoEdge );
        if ( DelayPrev > DelayD )
        {
            //printf( "Saving backup point at %d levels.\n", DelayD );
            Vec_IntFreeP( &vEdge1 );  vEdge1 = Vec_IntDup( p->vEdge1 );
            Vec_IntFreeP( &vEdge2 );  vEdge2 = Vec_IntDup( p->vEdge2 );
            DelayPrev = DelayD;
            iLast = i;
        }
        if ( fVerbose )
            printf( "\nIter %4d : Delay = %4d\n", i, DelayD );
        // collect critical nodes (nodes with critical edges)
        Edg_ManCollectCritEdges( p, vEdges, DelayD );
        // sort levels according to the number of critical edges
        if ( fLevelVerbose )
        {
            Vec_WecForEachLevel( vEdges, vLevel, k )
                Vec_IntPush( vLevel, k );
        }
        Vec_WecSort( vEdges, 0 );
        if ( fLevelVerbose )
        {
            Vec_WecForEachLevel( vEdges, vLevel, k )
            {
                int Level = Vec_IntPop( vLevel );
                printf( "%d: Level %2d : ", k, Level );
                Vec_IntPrint( vLevel );
            }
        }
        Vec_WecForEachLevel( vEdges, vLevel, k )
        {
            Vec_IntForEachEntry( vLevel, iObj, j )
                if ( Edg_ObjImprove(p, iObj, nEdges, DelayD, fVerbose) ) // improved
                    break;
            if ( j < Vec_IntSize(vLevel) )
                break;
        }
        if ( k == Vec_WecSize(vEdges) ) // if we could not improve anything, quit
            break;
    }
    Vec_WecFree( vEdges );
    // update to the saved version
    Vec_IntFreeP( &p->vEdge1 );  p->vEdge1 = vEdge1;
    Vec_IntFreeP( &p->vEdge2 );  p->vEdge2 = vEdge2;
    return DelayD;
}